

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alprd.hpp
# Opt level: O1

void duckdb::alp::AlpRDDecompression<double>::Decompress
               (uint8_t *left_encoded,uint8_t *right_encoded,uint16_t *left_parts_dict,
               EXACT_TYPE *output,idx_t values_count,uint16_t exceptions_count,uint16_t *exceptions,
               uint16_t *exceptions_positions,uint8_t left_bit_width,uint8_t right_bit_width)

{
  idx_t iVar1;
  uint16_t *out;
  uint64_t *out_00;
  ulong uVar2;
  ulong uVar3;
  uint8_t right_decoded [8192];
  uint8_t left_decoded [8192];
  uint64_t local_4038 [1024];
  uint16_t local_2038 [4100];
  
  out = local_2038;
  switchD_005700f1::default(out,0,0x2000);
  switchD_005700f1::default(local_4038,0,0x2000);
  if (values_count != 0) {
    uVar2 = 0;
    uVar3 = 0;
    do {
      duckdb_fastpforlib::internal::fastunpack_half
                ((uint16_t *)(left_encoded + (uVar2 >> 3)),out,(uint)left_bit_width);
      duckdb_fastpforlib::internal::fastunpack_half
                ((uint16_t *)((long)(left_encoded + (uVar2 >> 3)) + (ulong)left_bit_width * 2),
                 out + 0x10,(uint)left_bit_width);
      uVar3 = uVar3 + 0x20;
      uVar2 = uVar2 + (ulong)left_bit_width * 0x20;
      out = out + 0x20;
    } while (uVar3 < values_count);
    out_00 = local_4038;
    if (values_count != 0) {
      uVar2 = 0;
      uVar3 = 0;
      do {
        duckdb_fastpforlib::fastunpack
                  ((uint32_t *)(right_encoded + (uVar2 >> 3)),out_00,(uint)right_bit_width);
        uVar3 = uVar3 + 0x20;
        uVar2 = uVar2 + (ulong)right_bit_width * 0x20;
        out_00 = out_00 + 0x20;
      } while (uVar3 < values_count);
    }
  }
  if (values_count != 0) {
    iVar1 = 0;
    do {
      output[iVar1] =
           (ulong)left_parts_dict[local_2038[iVar1]] << (right_bit_width & 0x3f) | local_4038[iVar1]
      ;
      iVar1 = iVar1 + 1;
    } while (values_count != iVar1);
  }
  if (exceptions_count != 0) {
    uVar2 = 0;
    do {
      output[exceptions_positions[uVar2]] =
           (ulong)exceptions[uVar2] << (right_bit_width & 0x3f) |
           local_4038[exceptions_positions[uVar2]];
      uVar2 = uVar2 + 1;
    } while (exceptions_count != uVar2);
  }
  return;
}

Assistant:

static void Decompress(uint8_t *left_encoded, uint8_t *right_encoded, const uint16_t *left_parts_dict,
	                       EXACT_TYPE *output, idx_t values_count, uint16_t exceptions_count,
	                       const uint16_t *exceptions, const uint16_t *exceptions_positions, uint8_t left_bit_width,
	                       uint8_t right_bit_width) {

		uint8_t left_decoded[AlpRDConstants::ALP_VECTOR_SIZE * 8] = {0};
		uint8_t right_decoded[AlpRDConstants::ALP_VECTOR_SIZE * 8] = {0};

		// Bitunpacking left and right parts
		BitpackingPrimitives::UnPackBuffer<uint16_t>(left_decoded, left_encoded, values_count, left_bit_width);
		BitpackingPrimitives::UnPackBuffer<EXACT_TYPE>(right_decoded, right_encoded, values_count, right_bit_width);

		uint16_t *left_parts = reinterpret_cast<uint16_t *>(data_ptr_cast(left_decoded));
		EXACT_TYPE *right_parts = reinterpret_cast<EXACT_TYPE *>(data_ptr_cast(right_decoded));

		// Decoding
		for (idx_t i = 0; i < values_count; i++) {
			uint16_t left = left_parts_dict[left_parts[i]];
			EXACT_TYPE right = right_parts[i];
			output[i] = (static_cast<EXACT_TYPE>(left) << right_bit_width) | right;
		}

		// Exceptions Patching (exceptions only occur in left parts)
		for (idx_t i = 0; i < exceptions_count; i++) {
			EXACT_TYPE right = right_parts[exceptions_positions[i]];
			uint16_t left = exceptions[i];
			output[exceptions_positions[i]] = (static_cast<EXACT_TYPE>(left) << right_bit_width) | right;
		}
	}